

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIEnvironment::removeFont(CGUIEnvironment *this,IGUIFont *font)

{
  pointer pSVar1;
  IGUIFont *pIVar2;
  IGUIFont **ppIVar3;
  ulong uVar4;
  
  if (font != (IGUIFont *)0x0) {
    pSVar1 = (this->Fonts).m_data.
             super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppIVar3 = &pSVar1->Font;
    for (uVar4 = 0;
        (((long)(this->Fonts).m_data.
                super__Vector_base<irr::gui::CGUIEnvironment::SFont,_std::allocator<irr::gui::CGUIEnvironment::SFont>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x48 & 0xffffffffU) !=
        uVar4; uVar4 = uVar4 + 1) {
      pIVar2 = *ppIVar3;
      if (pIVar2 == font) {
        IReferenceCounted::drop
                  ((IReferenceCounted *)
                   ((long)&pIVar2->_vptr_IGUIFont + (long)pIVar2->_vptr_IGUIFont[-3]));
        core::array<irr::gui::CGUIEnvironment::SFont>::erase(&this->Fonts,(u32)uVar4);
        return;
      }
      ppIVar3 = ppIVar3 + 9;
    }
  }
  return;
}

Assistant:

void CGUIEnvironment::removeFont(IGUIFont *font)
{
	if (!font)
		return;
	for (u32 i = 0; i < Fonts.size(); ++i) {
		if (Fonts[i].Font == font) {
			Fonts[i].Font->drop();
			Fonts.erase(i);
			return;
		}
	}
}